

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

bool __thiscall HighFreqDataType::operator==(HighFreqDataType *this,HighFreqDataType *obj)

{
  bool bVar1;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool retval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  bool local_11;
  
  local_11 = std::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  local_11 = !local_11;
  bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_11 = false;
  }
  bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_11 = false;
  }
  if ((int)in_RDI[4]._M_string_length != *(int *)(in_RSI + 0x88)) {
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool HighFreqDataType::operator ==(const HighFreqDataType &obj) {
    bool retval = true;
    if (name != obj.name)
        retval = false;
    if (origin != obj.origin)
        retval = false;
    if (sockAddr != obj.sockAddr)
        retval = false;
    if (byteSize != obj.byteSize)
        retval = false;

    return(retval);
}